

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

int uv__tcsetattr(int fd,int how,termios *term)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int rc;
  termios *term_local;
  int how_local;
  int fd_local;
  
  do {
    iVar1 = tcsetattr(fd,how,(termios *)term);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    how_local = -*piVar2;
  }
  else {
    how_local = 0;
  }
  return how_local;
}

Assistant:

int uv__tcsetattr(int fd, int how, const struct termios *term) {
  int rc;

  do
    rc = tcsetattr(fd, how, term);
  while (rc == -1 && errno == EINTR);

  if (rc == -1)
    return UV__ERR(errno);

  return 0;
}